

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateOneCdataElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlElementType xVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr child;
  xmlNodePtr cur;
  int ret;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  cur._4_4_ = 1;
  if ((((ctxt == (xmlValidCtxtPtr)0x0) || (doc == (xmlDocPtr)0x0)) || (elem == (xmlNodePtr)0x0)) ||
     (elem->type != XML_ELEMENT_NODE)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    child = elem->children;
LAB_001e175a:
    if (child != (xmlNodePtr)0x0) {
      xVar1 = child->type;
      if (1 < xVar1 - XML_TEXT_NODE) {
        if (xVar1 == XML_ENTITY_REF_NODE) {
          if ((child->children != (_xmlNode *)0x0) && (child->children->children != (_xmlNode *)0x0)
             ) {
            nodeVPush(ctxt,child);
            child = child->children->children;
            goto LAB_001e175a;
          }
        }
        else if (1 < xVar1 - XML_PI_NODE) {
          cur._4_4_ = 0;
          goto LAB_001e1814;
        }
      }
      child = child->next;
      while (child == (xmlNodePtr)0x0) {
        pxVar2 = nodeVPop(ctxt);
        if (pxVar2 == (xmlNodePtr)0x0) {
          child = (xmlNodePtr)0x0;
          break;
        }
        child = pxVar2->next;
      }
      goto LAB_001e175a;
    }
LAB_001e1814:
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(ctxt->nodeTab);
      ctxt->nodeTab = (xmlNodePtr *)0x0;
    }
    ctxt_local._4_4_ = cur._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlValidateOneCdataElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                           xmlNodePtr elem) {
    int ret = 1;
    xmlNodePtr cur, child;

    if ((ctxt == NULL) || (doc == NULL) || (elem == NULL) ||
        (elem->type != XML_ELEMENT_NODE))
	return(0);

    child = elem->children;

    cur = child;
    while (cur != NULL) {
	switch (cur->type) {
	    case XML_ENTITY_REF_NODE:
		/*
		 * Push the current node to be able to roll back
		 * and process within the entity
		 */
		if ((cur->children != NULL) &&
		    (cur->children->children != NULL)) {
		    nodeVPush(ctxt, cur);
		    cur = cur->children->children;
		    continue;
		}
		break;
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		break;
	    default:
		ret = 0;
		goto done;
	}
	/*
	 * Switch to next element
	 */
	cur = cur->next;
	while (cur == NULL) {
	    cur = nodeVPop(ctxt);
	    if (cur == NULL)
		break;
	    cur = cur->next;
	}
    }
done:
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != NULL) {
	xmlFree(ctxt->nodeTab);
	ctxt->nodeTab = NULL;
    }
    return(ret);
}